

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapRiver(Layer *l,int *out,int x,int z,int w,int h)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  int *piVar14;
  long lVar15;
  
  uVar6 = (ulong)(uint)h;
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    lVar8 = (long)w;
    lVar4 = 0;
    if (0 < lVar8) {
      lVar4 = lVar8;
    }
    if (h < 1) {
      uVar6 = 0;
    }
    cVar1 = l->mc;
    piVar9 = out + lVar8 + 4;
    piVar10 = out + lVar8 * 2 + 5;
    uVar11 = 0;
    piVar14 = out;
    while (uVar11 != uVar6) {
      uVar11 = uVar11 + 1;
      for (lVar15 = 0; lVar4 * 4 != lVar15; lVar15 = lVar15 + 4) {
        uVar3 = *(uint *)((long)piVar9 + lVar15 + -8);
        uVar7 = *(uint *)((long)piVar9 + lVar15 + -4);
        uVar12 = *(uint *)((long)piVar9 + lVar15);
        uVar5 = *(uint *)((long)piVar14 + lVar15 + 4);
        uVar13 = *(uint *)((long)piVar10 + lVar15);
        if (cVar1 < '\n') {
          if (uVar7 != 0) goto LAB_00117f84;
LAB_00117f9d:
          *(undefined4 *)((long)out + lVar15) = 7;
        }
        else {
          if (1 < (int)uVar3) {
            uVar3 = uVar3 & 1 | 2;
          }
          if (1 < (int)uVar7) {
            uVar7 = uVar7 & 1 | 2;
          }
          if (1 < (int)uVar12) {
            uVar12 = uVar12 & 1 | 2;
          }
          if (1 < (int)uVar5) {
            uVar5 = uVar5 & 1 | 2;
          }
          if (1 < (int)uVar13) {
            uVar13 = uVar13 & 1 | 2;
          }
LAB_00117f84:
          if ((((uVar7 != uVar3) || (uVar7 != uVar5)) || (uVar7 != uVar13)) || (uVar7 != uVar12))
          goto LAB_00117f9d;
          *(undefined4 *)((long)out + lVar15) = 0xffffffff;
        }
      }
      out = out + lVar8;
      piVar9 = piVar9 + lVar8 + 2;
      piVar10 = piVar10 + lVar8 + 2;
      piVar14 = piVar14 + lVar8 + 2;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapRiver(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    int mc = l->mc;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v01 = vz1[i+0];
            int v11 = vz1[i+1];
            int v21 = vz1[i+2];
            int v10 = vz0[i+1];
            int v12 = vz2[i+1];

            if (mc >= MC_1_7)
            {
                v01 = reduceID(v01);
                v11 = reduceID(v11);
                v21 = reduceID(v21);
                v10 = reduceID(v10);
                v12 = reduceID(v12);
            }
            else if (v11 == 0)
            {
                out[i + j * w] = river;
                continue;
            }

            if (v11 == v01 && v11 == v10 && v11 == v12 && v11 == v21)
            {
                out[i + j * w] = -1;
            }
            else
            {
                out[i + j * w] = river;
            }
        }
    }

    return 0;
}